

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::AccessorVerifier::~AccessorVerifier
          (AccessorVerifier *this)

{
  LogMessage LStack_38;
  string local_28;
  
  if (this->needs_annotate_ == true) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message.cc"
               ,0x4da,"!needs_annotate_");
    cpp::(anonymous_namespace)::AccessorVerifier::Error_abi_cxx11_(&local_28,this);
    absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_38,&local_28);
  }
  else {
    if (this->needs_weak_descriptor_pin_ != true) {
      return;
    }
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message.cc"
               ,0x4db,"!needs_weak_descriptor_pin_");
    cpp::(anonymous_namespace)::AccessorVerifier::Error_abi_cxx11_(&local_28,this);
    absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_38,&local_28);
  }
  std::__cxx11::string::~string((string *)&local_28);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_38)
  ;
}

Assistant:

~AccessorVerifier() {
    ABSL_CHECK(!needs_annotate_) << Error(SourceLocation::current());
    ABSL_CHECK(!needs_weak_descriptor_pin_) << Error(SourceLocation::current());
  }